

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libpopcnt.h
# Opt level: O0

void align_avx2(uint8_t **p,uint64_t *size,uint64_t *cnt)

{
  uint64_t uVar1;
  uint64_t *cnt_local;
  uint64_t *size_local;
  uint8_t **p_local;
  
  while (((ulong)*p & 7) != 0) {
    uVar1 = popcnt64((ulong)**p);
    *cnt = uVar1 + *cnt;
    *size = *size - 1;
    *p = *p + 1;
  }
  while (((ulong)*p & 0x1f) != 0) {
    uVar1 = popcnt64(*(uint64_t *)*p);
    *cnt = uVar1 + *cnt;
    *size = *size - 8;
    *p = *p + 8;
  }
  return;
}

Assistant:

static inline void align_avx2(const uint8_t** p, uint64_t* size, uint64_t* cnt)
{
  for (; (uintptr_t) *p % 8; (*p)++)
  {
    *cnt += popcnt64(**p);
    *size -= 1;
  }
  for (; (uintptr_t) *p % 32; (*p) += 8)
  {
    *cnt += popcnt64(
        *(const uint64_t*) *p);
    *size -= 8;
  }
}